

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O2

void __thiscall ON_PointCloud::ON_PointCloud(ON_PointCloud *this,int capacity)

{
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00829740;
  ON_3dPointArray::ON_3dPointArray(&this->m_P,capacity);
  (this->m_N)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d918;
  (this->m_N).m_a = (ON_3dVector *)0x0;
  (this->m_N).m_count = 0;
  (this->m_N).m_capacity = 0;
  (this->m_C)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008261a0;
  (this->m_C).m_a = (ON_Color *)0x0;
  (this->m_C).m_count = 0;
  (this->m_C).m_capacity = 0;
  (this->m_V)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c348;
  (this->m_V).m_a = (double *)0x0;
  (this->m_V).m_count = 0;
  (this->m_V).m_capacity = 0;
  (this->m_H)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081bde8;
  (this->m_H).m_a = (bool *)0x0;
  (this->m_H).m_count = 0;
  (this->m_H).m_capacity = 0;
  this->m_hidden_count = 0;
  ON_Plane::ON_Plane(&this->m_plane);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  this->m_flags = 0;
  this->m_hidden_count = 0;
  return;
}

Assistant:

ON_PointCloud::ON_PointCloud( int capacity ) : m_P(capacity), m_flags(0)
{
  m_hidden_count=0;
}